

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Quantize_x86::forward(Quantize_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  int q;
  long lVar15;
  int i_1;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  Mat local_e8;
  char local_91;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  Mat *local_78;
  int local_6c;
  ulong local_68;
  size_t local_60;
  ulong local_58;
  size_t local_50;
  Option *local_48;
  Quantize_x86 *local_40;
  Mat *local_38;
  
  iVar16 = bottom_blob->elempack;
  iVar10 = bottom_blob->dims;
  local_88 = (ulong)(uint)bottom_blob->w;
  local_80 = (ulong)(uint)bottom_blob->h;
  local_58 = (ulong)(uint)bottom_blob->c;
  local_50 = (size_t)iVar16;
  if (iVar10 != 3) {
    local_6c = iVar10;
    if (iVar10 != 2) {
      if (iVar10 != 1) {
        return 0;
      }
      uVar8 = iVar16 * bottom_blob->w;
      sVar13 = 8;
      if (opt->use_packing_layout == false) {
        sVar13 = 1;
      }
      if ((uVar8 & 7) != 0) {
        sVar13 = 1;
      }
      Mat::create(top_blob,(int)uVar8 / (int)sVar13,sVar13,(int)sVar13,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        bVar19 = true;
      }
      else {
        bVar19 = (long)top_blob->c * top_blob->cstep == 0;
      }
      if (bVar19) {
        return -100;
      }
      uVar17 = (long)((ulong)(uint)((int)local_88 >> 0x1f) << 0x20 | local_88 & 0xffffffff) /
               (long)opt->num_threads;
      local_90 = 1;
      if (1 < (int)uVar17) {
        local_90 = uVar17 & 0xffffffff;
      }
      uVar17 = (long)((int)local_88 + (int)local_90 + -1) / (long)(int)local_90;
      local_91 = '\0';
      local_48 = opt;
      local_40 = this;
      if (0 < (int)uVar17) {
        local_78 = &(this->super_Quantize).scale_data;
        uVar17 = uVar17 & 0xffffffff;
        local_60 = local_90 * local_50;
        local_68 = local_60 * 4;
        lVar15 = 0;
        lVar14 = 0;
        uVar18 = local_88 & 0xffffffff;
        local_38 = top_blob;
        do {
          iVar9 = (int)local_90;
          iVar12 = (int)uVar18;
          iVar10 = iVar12;
          if (iVar9 < iVar12) {
            iVar10 = iVar9;
          }
          quantize((float *)((long)bottom_blob->data + lVar14),
                   (char *)((long)local_38->data + lVar15),local_78,iVar10 * iVar16,1);
          lVar14 = lVar14 + local_68;
          lVar15 = lVar15 + local_60;
          uVar18 = (ulong)(uint)-(iVar9 - iVar12);
          uVar17 = uVar17 - 1;
          top_blob = local_38;
        } while (uVar17 != 0);
      }
      if (local_91 != '\0') {
        return -100;
      }
      opt = local_48;
      this = local_40;
      if (local_6c == 3) goto LAB_0047a98a;
      if (local_6c != 2) {
        return 0;
      }
    }
    bVar11 = (iVar16 * (int)local_80 & 7U) == 0 & opt->use_packing_layout;
    local_78 = (Mat *)CONCAT71(local_78._1_7_,bVar11);
    local_60 = 1;
    if (bVar11 != 0) {
      local_60 = 8;
    }
    uVar17 = (long)(iVar16 * (int)local_80) / (long)(int)local_60;
    iVar10 = (int)uVar17;
    Mat::create(top_blob,(int)local_88,iVar10,local_60,(int)local_60,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar19 = true;
    }
    else {
      bVar19 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar19) {
      return -100;
    }
    local_68 = local_68 & 0xffffffffffffff00;
    local_90 = CONCAT44(local_90._4_4_,iVar16);
    local_48 = opt;
    if (((byte)local_78 == '\x01' && iVar16 == 4) && 0 < iVar10) {
      uVar18 = 0;
      do {
        pvVar1 = bottom_blob->data;
        lVar14 = (long)bottom_blob->w * bottom_blob->elemsize;
        iVar16 = top_blob->w;
        sVar13 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          local_e8.data = (this->super_Quantize).scale_data.data;
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_e8.refcount._0_4_ = SUB84(piVar7,0);
          local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_e8.elemsize._0_4_ = (undefined4)sVar3;
          local_e8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.dims = (this->super_Quantize).scale_data.dims;
          local_e8.w = (this->super_Quantize).scale_data.w;
          local_e8.h = (this->super_Quantize).scale_data.h;
          local_e8.d = (this->super_Quantize).scale_data.d;
          local_e8.c = (this->super_Quantize).scale_data.c;
          local_e8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
        }
        else {
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_e8.data =
               (void *)(uVar18 * sVar3 * 8 + (long)(this->super_Quantize).scale_data.data);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.refcount._0_4_ = 0;
          local_e8.refcount._4_4_ = 0;
          local_e8.elemsize._0_4_ = (undefined4)sVar3;
          local_e8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_e8.dims = 1;
          local_e8.w = 8;
          local_e8.h = 1;
          local_e8.d = 1;
          local_e8.c = 1;
          local_e8.cstep = 8;
        }
        quantize_pack4to8((float *)(uVar18 * 2 * lVar14 + (long)pvVar1),
                          (float *)((uVar18 * 2 + 1) * lVar14 + (long)pvVar1),
                          (char *)((long)iVar16 * uVar18 * sVar13 + (long)pvVar2),&local_e8,
                          (int)local_88);
        piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = 0;
        local_e8.elemsize._4_4_ = 0;
        local_e8.elempack = 0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uVar17 & 0xffffffff));
    }
    if (((0 < (int)local_80 && (int)local_90 == 4) & ~(byte)local_78) == 1) {
      lVar14 = 3;
      uVar17 = 0;
      do {
        iVar16 = bottom_blob->w;
        sVar13 = bottom_blob->elemsize;
        pvVar1 = top_blob->data;
        lVar15 = (long)top_blob->w * top_blob->elemsize;
        pvVar2 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          local_e8.data = (this->super_Quantize).scale_data.data;
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_e8.refcount._0_4_ = SUB84(piVar7,0);
          local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_e8.elemsize._0_4_ = (undefined4)sVar3;
          local_e8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.dims = (this->super_Quantize).scale_data.dims;
          local_e8.w = (this->super_Quantize).scale_data.w;
          local_e8.h = (this->super_Quantize).scale_data.h;
          local_e8.d = (this->super_Quantize).scale_data.d;
          local_e8.c = (this->super_Quantize).scale_data.c;
          local_e8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
        }
        else {
          sVar3 = (this->super_Quantize).scale_data.elemsize;
          local_e8.data =
               (void *)(sVar3 * (lVar14 + -3) + (long)(this->super_Quantize).scale_data.data);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.refcount._0_4_ = 0;
          local_e8.refcount._4_4_ = 0;
          local_e8.elemsize._0_4_ = (undefined4)sVar3;
          local_e8.elemsize._4_4_ = (undefined4)(sVar3 >> 0x20);
          local_e8.dims = 1;
          local_e8.w = 4;
          local_e8.h = 1;
          local_e8.d = 1;
          local_e8.c = 1;
          local_e8.cstep = 4;
        }
        quantize_pack4to1((float *)((long)iVar16 * uVar17 * sVar13 + (long)pvVar2),
                          (char *)((lVar14 + -3) * lVar15 + (long)pvVar1),
                          (char *)((lVar14 + -2) * lVar15 + (long)pvVar1),
                          (char *)((lVar14 + -1) * lVar15 + (long)pvVar1),
                          (char *)(lVar15 * lVar14 + (long)pvVar1),&local_e8,(int)local_88);
        piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = 0;
        local_e8.elemsize._4_4_ = 0;
        local_e8.elempack = 0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + 4;
      } while (local_80 != uVar17);
    }
    if (0 < (int)local_80 && (int)local_90 == (int)local_60) {
      lVar14 = 0;
      uVar17 = 0;
      do {
        iVar16 = bottom_blob->w;
        sVar13 = bottom_blob->elemsize;
        pvVar1 = bottom_blob->data;
        iVar10 = top_blob->w;
        sVar3 = top_blob->elemsize;
        pvVar2 = top_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          local_e8.data = (this->super_Quantize).scale_data.data;
          piVar7 = (this->super_Quantize).scale_data.refcount;
          local_e8.refcount._0_4_ = SUB84(piVar7,0);
          local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_e8.elemsize._0_4_ = (undefined4)sVar4;
          local_e8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.dims = (this->super_Quantize).scale_data.dims;
          local_e8.w = (this->super_Quantize).scale_data.w;
          local_e8.h = (this->super_Quantize).scale_data.h;
          local_e8.d = (this->super_Quantize).scale_data.d;
          local_e8.c = (this->super_Quantize).scale_data.c;
          local_e8.cstep = (this->super_Quantize).scale_data.cstep;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
        }
        else {
          sVar4 = (this->super_Quantize).scale_data.elemsize;
          local_e8.data = (void *)(sVar4 * lVar14 + (long)(this->super_Quantize).scale_data.data);
          local_e8.elempack = (this->super_Quantize).scale_data.elempack;
          local_e8.allocator = (this->super_Quantize).scale_data.allocator;
          local_e8.refcount._0_4_ = 0;
          local_e8.refcount._4_4_ = 0;
          local_e8.elemsize._0_4_ = (undefined4)sVar4;
          local_e8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
          local_e8.w = (int)local_90;
          local_e8.dims = 1;
          local_e8.h = 1;
          local_e8.d = 1;
          local_e8.c = 1;
          local_e8.cstep = local_50;
        }
        quantize((float *)((long)iVar16 * uVar17 * sVar13 + (long)pvVar1),
                 (char *)((long)iVar10 * uVar17 * sVar3 + (long)pvVar2),&local_e8,(int)local_88,
                 (int)local_90);
        piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = 0;
        local_e8.elemsize._4_4_ = 0;
        local_e8.elempack = 0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + local_50;
      } while (local_80 != uVar17);
    }
    if ((char)local_68 != '\0') {
      return -100;
    }
    opt = local_48;
    iVar16 = (int)local_90;
    if (local_6c != 3) {
      return 0;
    }
  }
LAB_0047a98a:
  bVar11 = (iVar16 * (int)local_58 & 7U) == 0 & opt->use_packing_layout;
  local_78 = (Mat *)CONCAT71(local_78._1_7_,bVar11);
  sVar13 = 1;
  if (bVar11 != 0) {
    sVar13 = 8;
  }
  uVar17 = (long)(iVar16 * (int)local_58) / (long)(int)sVar13;
  iVar10 = (int)uVar17;
  Mat::create(top_blob,(int)local_88,(int)local_80,iVar10,sVar13,(int)sVar13,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    bVar19 = true;
  }
  else {
    bVar19 = (long)top_blob->c * top_blob->cstep == 0;
  }
  if (bVar19) {
    return -100;
  }
  local_68 = local_68 & 0xffffffffffffff00;
  local_90 = CONCAT44(local_90._4_4_,iVar16);
  local_60 = sVar13;
  if (((byte)local_78 == '\x01' && iVar16 == 4) && 0 < iVar10) {
    iVar16 = (int)local_80 * (int)local_88;
    uVar18 = 0;
    do {
      sVar13 = bottom_blob->cstep;
      pvVar1 = bottom_blob->data;
      sVar3 = bottom_blob->elemsize;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar2 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        local_e8.data = (this->super_Quantize).scale_data.data;
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_e8.refcount._0_4_ = SUB84(piVar7,0);
        local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.dims = (this->super_Quantize).scale_data.dims;
        local_e8.w = (this->super_Quantize).scale_data.w;
        local_e8.h = (this->super_Quantize).scale_data.h;
        local_e8.d = (this->super_Quantize).scale_data.d;
        local_e8.c = (this->super_Quantize).scale_data.c;
        local_e8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.data = (void *)(uVar18 * sVar6 * 8 + (long)(this->super_Quantize).scale_data.data);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.dims = 1;
        local_e8.w = 8;
        local_e8.h = 1;
        local_e8.d = 1;
        local_e8.c = 1;
        local_e8.cstep = 8;
      }
      quantize_pack4to8((float *)(uVar18 * 2 * sVar13 * sVar3 + (long)pvVar1),
                        (float *)((uVar18 * 2 + 1) * sVar13 * sVar3 + (long)pvVar1),
                        (char *)(sVar4 * uVar18 * sVar5 + (long)pvVar2),&local_e8,iVar16);
      piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uVar17 & 0xffffffff));
  }
  if (((0 < (int)local_58 && (int)local_90 == 4) & ~(byte)local_78) == 1) {
    iVar16 = (int)local_80 * (int)local_88;
    lVar14 = 3;
    uVar17 = 0;
    do {
      sVar13 = bottom_blob->cstep;
      sVar3 = bottom_blob->elemsize;
      sVar4 = top_blob->cstep;
      pvVar1 = top_blob->data;
      sVar5 = top_blob->elemsize;
      pvVar2 = bottom_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        local_e8.data = (this->super_Quantize).scale_data.data;
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_e8.refcount._0_4_ = SUB84(piVar7,0);
        local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.dims = (this->super_Quantize).scale_data.dims;
        local_e8.w = (this->super_Quantize).scale_data.w;
        local_e8.h = (this->super_Quantize).scale_data.h;
        local_e8.d = (this->super_Quantize).scale_data.d;
        local_e8.c = (this->super_Quantize).scale_data.c;
        local_e8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.data =
             (void *)(sVar6 * (lVar14 + -3) + (long)(this->super_Quantize).scale_data.data);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.dims = 1;
        local_e8.w = 4;
        local_e8.h = 1;
        local_e8.d = 1;
        local_e8.c = 1;
        local_e8.cstep = 4;
      }
      quantize_pack4to1((float *)(sVar13 * uVar17 * sVar3 + (long)pvVar2),
                        (char *)((lVar14 + -3) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar14 + -2) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)((lVar14 + -1) * sVar4 * sVar5 + (long)pvVar1),
                        (char *)(sVar4 * lVar14 * sVar5 + (long)pvVar1),&local_e8,iVar16);
      piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 4;
    } while (local_58 != uVar17);
  }
  if (0 < (int)local_58 && (int)local_90 == (int)local_60) {
    local_80 = (ulong)(uint)((int)local_80 * (int)local_88);
    lVar14 = 0;
    uVar17 = 0;
    do {
      sVar13 = bottom_blob->cstep;
      sVar3 = bottom_blob->elemsize;
      pvVar1 = bottom_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar2 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        local_e8.data = (this->super_Quantize).scale_data.data;
        piVar7 = (this->super_Quantize).scale_data.refcount;
        local_e8.refcount._0_4_ = SUB84(piVar7,0);
        local_e8.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.dims = (this->super_Quantize).scale_data.dims;
        local_e8.w = (this->super_Quantize).scale_data.w;
        local_e8.h = (this->super_Quantize).scale_data.h;
        local_e8.d = (this->super_Quantize).scale_data.d;
        local_e8.c = (this->super_Quantize).scale_data.c;
        local_e8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
      }
      else {
        sVar6 = (this->super_Quantize).scale_data.elemsize;
        local_e8.data = (void *)(sVar6 * lVar14 + (long)(this->super_Quantize).scale_data.data);
        local_e8.elempack = (this->super_Quantize).scale_data.elempack;
        local_e8.allocator = (this->super_Quantize).scale_data.allocator;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize._0_4_ = (undefined4)sVar6;
        local_e8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
        local_e8.w = (int)local_90;
        local_e8.dims = 1;
        local_e8.h = 1;
        local_e8.d = 1;
        local_e8.c = 1;
        local_e8.cstep = local_50;
      }
      quantize((float *)(sVar13 * uVar17 * sVar3 + (long)pvVar1),
               (char *)(sVar4 * uVar17 * sVar5 + (long)pvVar2),&local_e8,(int)local_80,(int)local_90
              );
      piVar7 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + local_50;
    } while (local_58 != uVar17);
  }
  if ((char)local_68 == '\0') {
    return 0;
  }
  return -100;
}

Assistant:

int Quantize_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}